

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O1

int __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>::clone
          (FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>
           *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_20 [8];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = *(undefined8 *)(__fn + 8);
  local_10 = *(undefined8 *)(__fn + 0x10);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10)->_M_use_count + 1;
    }
  }
  std::
  make_unique<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,supermap::Key<1ul>>,supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,supermap::Key<1ul>>::clone()const::_lambda()_1_,std::function<supermap::Key<1ul>(supermap::KeyValue<supermap::Key<1ul>,unsigned_long>const&)>const&>
            ((anon_class_16_1_552cbcb6 *)local_20,
             (function<supermap::Key<1UL>_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&)>
              *)&stack0xffffffffffffffe8);
  (this->
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  ).
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>
  ._vptr_Cloneable = (_func_int **)local_20;
  local_20 = (undefined1  [8])0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10);
  }
  return (int)this;
}

Assistant:

std::unique_ptr<StorageItemRegister<RegisterT, std::shared_ptr<FilterBase>>>
    clone() const override {
        return std::make_unique<FilteringRegister<RegisterT, FilterT>>(
            [filter = filter_]() { return filter->clone(); },
            func_
        );
    }